

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxBinaryLogical::Resolve(FxBinaryLogical *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *pFVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FxConstant *pFVar6;
  FxExpression *x_7;
  FxExpression *x_6;
  FxExpression *x_5;
  FxExpression *x_4;
  FxExpression *x_3;
  FxExpression *x_2;
  FxExpression *x_1;
  FxExpression *x;
  undefined1 local_48 [28];
  int b_right;
  int b_left;
  PType *local_20;
  FCompileContext *ctx_local;
  FxBinaryLogical *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = (PType *)ctx;
    ctx_local = (FCompileContext *)this;
    if (this->left != (FxExpression *)0x0) {
      iVar3 = (*this->left->_vptr_FxExpression[2])();
      this->left = (FxExpression *)CONCAT44(extraout_var,iVar3);
    }
    if (this->right != (FxExpression *)0x0) {
      ctx = (FCompileContext *)local_20;
      iVar3 = (*this->right->_vptr_FxExpression[2])();
      this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
    }
    if ((this->right == (FxExpression *)0x0) || (this->left == (FxExpression *)0x0)) {
      if (this != (FxBinaryLogical *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxBinaryLogical *)0x0;
    }
    else {
      if (this->left->ValueType != (PType *)TypeBool) {
        pFVar5 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
        ctx = (FCompileContext *)this->left;
        FxBoolCast::FxBoolCast(pFVar5,(FxExpression *)ctx,true);
        this->left = (FxExpression *)pFVar5;
        if (this->left != (FxExpression *)0x0) {
          ctx = (FCompileContext *)local_20;
          iVar3 = (*this->left->_vptr_FxExpression[2])();
          this->left = (FxExpression *)CONCAT44(extraout_var_01,iVar3);
        }
        if (this->left == (FxExpression *)0x0) {
          if (this != (FxBinaryLogical *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      if (this->right->ValueType != (PType *)TypeBool) {
        pFVar5 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
        ctx = (FCompileContext *)this->right;
        FxBoolCast::FxBoolCast(pFVar5,(FxExpression *)ctx,true);
        this->right = (FxExpression *)pFVar5;
        if (this->right != (FxExpression *)0x0) {
          ctx = (FCompileContext *)local_20;
          iVar3 = (*this->right->_vptr_FxExpression[2])();
          this->right = (FxExpression *)CONCAT44(extraout_var_02,iVar3);
        }
        if (this->right == (FxExpression *)0x0) {
          if (this != (FxBinaryLogical *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      local_48._24_4_ = 0xffffffff;
      local_48._20_4_ = ~EFX_Expression;
      uVar4 = (*this->left->_vptr_FxExpression[3])();
      if ((uVar4 & 1) != 0) {
        ctx = (FCompileContext *)this->left;
        FxConstant::GetValue((FxConstant *)local_48);
        bVar2 = ExpVal::GetBool((ExpVal *)local_48);
        local_48._24_4_ = ZEXT14(bVar2);
        ExpVal::~ExpVal((ExpVal *)local_48);
      }
      uVar4 = (*this->right->_vptr_FxExpression[3])();
      if ((uVar4 & 1) != 0) {
        ctx = (FCompileContext *)this->right;
        FxConstant::GetValue((FxConstant *)&x);
        bVar2 = ExpVal::GetBool((ExpVal *)&x);
        local_48._20_4_ = ZEXT14(bVar2);
        ExpVal::~ExpVal((ExpVal *)&x);
      }
      if (this->Operator == 0x11b) {
        if ((local_48._24_4_ == 0) || (local_48._20_4_ == EFX_Expression)) {
          pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
          FxConstant::FxConstant(pFVar6,true,&(this->super_FxExpression).ScriptPosition);
          if (this == (FxBinaryLogical *)0x0) {
            return &pFVar6->super_FxExpression;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return &pFVar6->super_FxExpression;
        }
        if ((local_48._24_4_ == 1) && (local_48._20_4_ == EFX_Identifier)) {
          pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
          FxConstant::FxConstant(pFVar6,false,&(this->super_FxExpression).ScriptPosition);
          if (this == (FxBinaryLogical *)0x0) {
            return &pFVar6->super_FxExpression;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return &pFVar6->super_FxExpression;
        }
        if (local_48._24_4_ == 1) {
          pFVar1 = this->right;
          this->right = (FxExpression *)0x0;
          if (this == (FxBinaryLogical *)0x0) {
            return pFVar1;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return pFVar1;
        }
        if (local_48._20_4_ == EFX_Identifier) {
          pFVar1 = this->left;
          this->left = (FxExpression *)0x0;
          if (this == (FxBinaryLogical *)0x0) {
            return pFVar1;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return pFVar1;
        }
      }
      else if (this->Operator == 0x11c) {
        if ((local_48._24_4_ == 1) || (local_48._20_4_ == EFX_Identifier)) {
          pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
          FxConstant::FxConstant(pFVar6,true,&(this->super_FxExpression).ScriptPosition);
          if (this == (FxBinaryLogical *)0x0) {
            return &pFVar6->super_FxExpression;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return &pFVar6->super_FxExpression;
        }
        if ((local_48._24_4_ == 0) && (local_48._20_4_ == EFX_Expression)) {
          pFVar6 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
          FxConstant::FxConstant(pFVar6,false,&(this->super_FxExpression).ScriptPosition);
          if (this == (FxBinaryLogical *)0x0) {
            return &pFVar6->super_FxExpression;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return &pFVar6->super_FxExpression;
        }
        if (local_48._24_4_ == 0) {
          pFVar1 = this->right;
          this->right = (FxExpression *)0x0;
          if (this == (FxBinaryLogical *)0x0) {
            return pFVar1;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return pFVar1;
        }
        if (local_48._20_4_ == EFX_Expression) {
          pFVar1 = this->left;
          this->left = (FxExpression *)0x0;
          if (this == (FxBinaryLogical *)0x0) {
            return pFVar1;
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
          return pFVar1;
        }
      }
      Flatten(this);
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxBinaryLogical::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (left->ValueType != TypeBool)
	{
		left = new FxBoolCast(left);
		SAFE_RESOLVE(left, ctx);
	}
	if (right->ValueType != TypeBool)
	{
		right = new FxBoolCast(right);
		SAFE_RESOLVE(right, ctx);
	}

	int b_left=-1, b_right=-1;
	if (left->isConstant()) b_left = static_cast<FxConstant *>(left)->GetValue().GetBool();
	if (right->isConstant()) b_right = static_cast<FxConstant *>(right)->GetValue().GetBool();

	// Do some optimizations. This will throw out all sub-expressions that are not
	// needed to retrieve the final result.
	if (Operator == TK_AndAnd)
	{
		if (b_left==0 || b_right==0)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1 && b_right==1)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==1)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==1)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	else if (Operator == TK_OrOr)
	{
		if (b_left==1 || b_right==1)
		{
			FxExpression *x = new FxConstant(true, ScriptPosition);
			delete this;
			return x;
		}
		if (b_left==0 && b_right==0)
		{
			FxExpression *x = new FxConstant(false, ScriptPosition);
			delete this;
			return x;
		}
		else if (b_left==0)
		{
			FxExpression *x = right;
			right=nullptr;
			delete this;
			return x;
		}
		else if (b_right==0)
		{
			FxExpression *x = left;
			left=nullptr;
			delete this;
			return x;
		}
	}
	Flatten();
	return this;
}